

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O1

int av1_tpl_setup_stats(AV1_COMP *cpi,int gop_eval,EncodeFrameParams *frame_params)

{
  scale_factors *sf;
  TplParams *tpl_data;
  FRAME_TYPE FVar1;
  TX_SIZE tx_size;
  byte bVar2;
  FRAME_UPDATE_TYPE type;
  aom_enc_pass aVar3;
  AV1_PRIMARY *pAVar4;
  AV1_PRIMARY *pAVar5;
  RefCntBuffer *pRVar6;
  TplDepFrame *pTVar7;
  TplDepFrame *pTVar8;
  TplDepFrame *pTVar9;
  STATS_BUFFER_CTX *pSVar10;
  uint uVar11;
  bool bVar12;
  int i;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int *piVar20;
  lookahead_entry *plVar21;
  YV12_BUFFER_CONFIG *pYVar22;
  uint8_t *puVar23;
  int16_t *piVar24;
  tran_low_t *ptVar25;
  BLOCK_SIZE BVar26;
  int flags;
  long lVar27;
  RefCntBuffer **ppRVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  EncodeFrameParams *pEVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  EncodeFrameParams *pEVar37;
  FIRSTPASS_STATS *pFVar38;
  int i_2;
  uint uVar39;
  ulong uVar40;
  long lVar41;
  FIRSTPASS_STATS *pFVar42;
  uint32_t uVar43;
  ulong uVar44;
  bool bVar45;
  bool bVar46;
  byte bVar47;
  double dVar48;
  double dVar49;
  int aiStackY_1e1f8 [30664];
  int local_2a8;
  uint local_290;
  int local_284;
  int local_250;
  int num_arf_layers;
  int remapped_ref_idx [8];
  RefFrameMapPair ref_frame_map_pairs [8];
  int ref_picture_map [8];
  EncodeFrameParams frame_params_1;
  FRAME_DIFF local_90;
  EncodeFrameParams this_frame_params;
  
  bVar47 = 0;
  pAVar4 = cpi->ppi;
  pEVar32 = frame_params;
  pEVar37 = &this_frame_params;
  for (lVar27 = 0x13; lVar27 != 0; lVar27 = lVar27 + -1) {
    pEVar37->error_resilient_mode = pEVar32->error_resilient_mode;
    pEVar32 = (EncodeFrameParams *)&pEVar32->frame_type;
    pEVar37 = (EncodeFrameParams *)&pEVar37->frame_type;
  }
  tpl_data = &pAVar4->tpl_data;
  if (cpi->superres_mode == AOM_SUPERRES_NONE) {
    (cpi->common).current_frame.frame_type = frame_params->frame_type;
    uVar44 = (ulong)cpi->gf_frame_index;
    if ((int)(uint)cpi->gf_frame_index < (pAVar4->gf_group).size) {
      do {
        (cpi->common).current_frame.frame_type = (pAVar4->gf_group).frame_type[uVar44];
        av1_configure_buffer_updates
                  (cpi,&this_frame_params.refresh_frame,(pAVar4->gf_group).update_type[uVar44],
                   (pAVar4->gf_group).refbuf_state[uVar44],0);
        (cpi->refresh_frame).alt_ref_frame = this_frame_params.refresh_frame.alt_ref_frame;
        (cpi->refresh_frame).golden_frame = this_frame_params.refresh_frame.golden_frame;
        (cpi->refresh_frame).bwd_ref_frame = this_frame_params.refresh_frame.bwd_ref_frame;
        uVar44 = uVar44 + 1;
      } while ((int)uVar44 < (pAVar4->gf_group).size);
    }
    pAVar5 = cpi->ppi;
    if ((pAVar5->gf_group).update_type[cpi->gf_frame_index] == '\0') {
      ref_frame_map_pairs[7].pyr_level = -1;
      ref_frame_map_pairs[6].pyr_level = -1;
      ref_frame_map_pairs[6].disp_order = -1;
      ref_frame_map_pairs[7].disp_order = -1;
      ref_frame_map_pairs[5].pyr_level = -1;
      ref_frame_map_pairs[4].pyr_level = -1;
      ref_frame_map_pairs[4].disp_order = -1;
      ref_frame_map_pairs[5].disp_order = -1;
      ref_frame_map_pairs[3].pyr_level = -1;
      ref_frame_map_pairs[2].pyr_level = -1;
      ref_frame_map_pairs[2].disp_order = -1;
      ref_frame_map_pairs[3].disp_order = -1;
      ref_frame_map_pairs[1].pyr_level = -1;
      ref_frame_map_pairs[0].pyr_level = -1;
      ref_frame_map_pairs[0].disp_order = -1;
      ref_frame_map_pairs[1].disp_order = -1;
    }
    else {
      piVar20 = &ref_frame_map_pairs[1].disp_order;
      ref_frame_map_pairs[6].pyr_level = 0;
      ref_frame_map_pairs[6].disp_order = 0;
      ref_frame_map_pairs[7].pyr_level = 0;
      ref_frame_map_pairs[7].disp_order = 0;
      ref_frame_map_pairs[4].pyr_level = 0;
      ref_frame_map_pairs[4].disp_order = 0;
      ref_frame_map_pairs[5].pyr_level = 0;
      ref_frame_map_pairs[5].disp_order = 0;
      ref_frame_map_pairs[2].pyr_level = 0;
      ref_frame_map_pairs[2].disp_order = 0;
      ref_frame_map_pairs[3].pyr_level = 0;
      ref_frame_map_pairs[3].disp_order = 0;
      ref_frame_map_pairs[0].pyr_level = 0;
      ref_frame_map_pairs[0].disp_order = 0;
      ref_frame_map_pairs[1].pyr_level = 0;
      ref_frame_map_pairs[1].disp_order = 0;
      ppRVar28 = (cpi->common).ref_frame_map;
      lVar27 = 1;
      uVar44 = 0;
      do {
        ppRVar28 = ppRVar28 + 1;
        uVar40 = 6;
        if (6 < uVar44) {
          uVar40 = uVar44;
        }
        if (ref_frame_map_pairs[uVar44].disp_order != -1) {
          pRVar6 = (cpi->common).ref_frame_map[uVar44];
          if (pRVar6 == (RefCntBuffer *)0x0) {
            ref_frame_map_pairs[uVar44].disp_order = -1;
            uVar15 = 0xffffffff;
          }
          else {
            if ((uVar44 != 7) && (1 < pRVar6->ref_count)) {
              lVar41 = 0;
              do {
                if (ppRVar28[lVar41] == pRVar6) {
                  *(undefined8 *)(piVar20 + lVar41 * 2 + -1) = 0xffffffffffffffff;
                }
                lVar41 = lVar41 + 1;
              } while (uVar40 + lVar27 != lVar41);
            }
            ref_frame_map_pairs[uVar44].disp_order = pRVar6->display_order_hint;
            uVar15 = pRVar6->pyramid_level;
          }
          ref_frame_map_pairs[uVar44].pyr_level = uVar15;
        }
        uVar44 = uVar44 + 1;
        piVar20 = piVar20 + 2;
        lVar27 = lVar27 + -1;
      } while (uVar44 != 8);
    }
    pEVar32 = frame_params;
    pEVar37 = &frame_params_1;
    for (lVar27 = 0x13; lVar27 != 0; lVar27 = lVar27 + -1) {
      pEVar37->error_resilient_mode = pEVar32->error_resilient_mode;
      pEVar32 = (EncodeFrameParams *)((long)pEVar32 + (ulong)bVar47 * -8 + 4);
      pEVar37 = (EncodeFrameParams *)((long)pEVar37 + (ulong)bVar47 * -8 + 4);
    }
    iVar13 = -1;
    lVar27 = 0x1e090;
    lVar41 = 0;
    FVar1 = frame_params_1.frame_type;
    do {
      if (FVar1 == '\0') {
        pTVar7 = (pAVar5->tpl_data).tpl_frame;
        *(undefined4 *)((long)pTVar7->ref_map_index + lVar41 + -0x28) = 0;
        *(undefined1 (*) [16])((long)pTVar7->ref_map_index + lVar41 + -0x70) = (undefined1  [16])0x0
        ;
      }
      else {
        pTVar7 = (pAVar5->tpl_data).tpl_frame;
        *(long *)((long)pTVar7->ref_map_index + lVar41 + -0x70) =
             *(long *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar27 * 2) +
             0x4e0;
        *(long *)((long)pTVar7->ref_map_index + lVar41 + -0x68) =
             *(long *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar27 * 2) +
             0x4e0;
        *(undefined4 *)((long)pTVar7->ref_map_index + lVar41 + -0x28) =
             *(undefined4 *)
              (*(long *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar27 * 2) +
              0x24);
      }
      *(int *)((long)aiStackY_1e1f8 + lVar27) = iVar13;
      lVar41 = lVar41 + -0x60;
      iVar13 = iVar13 + -1;
      lVar27 = lVar27 + 4;
    } while (lVar41 != -0x300);
    uVar15 = (pAVar4->gf_group).size;
    uVar19 = 0x5f;
    if ((int)uVar15 < 0x5f) {
      uVar19 = uVar15;
    }
    if ((int)uVar15 < 1) {
      local_284 = 0;
      uVar15 = 0;
      uVar44 = 0;
      local_2a8 = 0;
    }
    else {
      lVar27 = 0x20;
      local_284 = 0;
      uVar15 = 0;
      uVar44 = 0;
      local_2a8 = 0;
      do {
        pTVar7 = (pAVar5->tpl_data).tpl_frame;
        bVar47 = (pAVar4->gf_group).update_type[uVar44];
        frame_params_1.show_frame = (int)(bVar47 != 6 && bVar47 != 3);
        frame_params_1.show_existing_frame = (int)((bVar47 & 0xfe) == 4);
        frame_params_1.frame_type = (pAVar4->gf_group).frame_type[uVar44];
        if (bVar47 == 1) {
          local_284 = (pAVar4->gf_group).q_val[uVar44];
        }
        iVar13 = (uint)(pAVar4->gf_group).arf_src_offset[uVar44] +
                 (uint)(pAVar4->gf_group).cur_frame_idx[uVar44];
        plVar21 = av1_lookahead_peek(cpi->ppi->lookahead,iVar13,cpi->compressor_stage);
        if (plVar21 != (lookahead_entry *)0x0) {
          pTVar7[uVar44].gf_picture = &plVar21->img;
          iVar16 = (int)uVar44;
          pYVar22 = av1_tf_info_get_filtered_buf(&cpi->ppi->tf_info,iVar16,&local_90);
          if (pYVar22 != (YV12_BUFFER_CONFIG *)0x0) {
            pTVar7[uVar44].gf_picture = pYVar22;
          }
          uVar43 = iVar13 + (cpi->common).current_frame.frame_number;
          pTVar7[uVar44].frame_display_index = uVar43;
          if ((byte)(bVar47 - 6) < 0xfe) {
            pTVar7[uVar44].rec_picture = (pAVar5->tpl_data).tpl_rec_pool + local_2a8;
            pTVar7[uVar44].tpl_stats_ptr = (pAVar5->tpl_data).tpl_stats_pool[local_2a8];
            local_2a8 = local_2a8 + 1;
          }
          av1_get_ref_frames(ref_frame_map_pairs,uVar43,cpi,iVar16,0,remapped_ref_idx);
          iVar13 = av1_get_refresh_frame_flags
                             (cpi,&frame_params_1,bVar47,iVar16,uVar43,ref_frame_map_pairs);
          if ((cpi->ppi->gf_group).is_frame_non_ref[uVar44] != false) {
            iVar13 = 0;
          }
          iVar14 = av1_get_refresh_ref_frame_map(iVar13);
          if (iVar14 != -1 && iVar14 < 8) {
            bVar45 = uVar43 != 0;
            if ((int)uVar43 < 1) {
              uVar43 = 0;
            }
            ref_frame_map_pairs[iVar14].disp_order = uVar43;
            iVar17 = 1;
            if (bVar45) {
              iVar18 = (pAVar4->gf_group).layer_depth[uVar44];
              if (iVar18 == 6) {
                iVar17 = (cpi->ppi->gf_group).max_layer_depth;
              }
              else if ((iVar18 != 7) && (iVar17 = iVar18, iVar18 < 2)) {
                iVar17 = 1;
              }
            }
            ref_frame_map_pairs[iVar14].pyr_level = iVar17;
          }
          lVar41 = 0;
          do {
            *(int *)((long)pTVar7->ref_map_index + lVar41 * 4 + lVar27 + -0x20) =
                 ref_picture_map[remapped_ref_idx[lVar41]];
            lVar41 = lVar41 + 1;
          } while (lVar41 != 7);
          if (iVar13 != 0) {
            ref_picture_map[iVar14] = iVar16;
          }
          uVar15 = uVar15 + 1;
        }
        if (plVar21 == (lookahead_entry *)0x0) goto LAB_00239e21;
        uVar44 = uVar44 + 1;
        lVar27 = lVar27 + 0x60;
      } while (uVar44 != uVar19);
      uVar44 = (ulong)uVar19;
    }
LAB_00239e21:
    iVar16 = (cpi->oxcf).gf_cfg.lag_in_frames + -0x20;
    iVar13 = (cpi->rc).frames_to_key - (cpi->ppi->p_rc).baseline_gf_interval;
    if (iVar16 < iVar13) {
      iVar13 = iVar16;
    }
    if (((uint)uVar44 < 0x60) && (0 < iVar13)) {
      iVar14 = (uint)(pAVar4->gf_group).cur_frame_idx[(long)(int)uVar19 + -1] +
               (uint)(pAVar4->gf_group).arf_src_offset[(long)(int)uVar19 + -1] + 1;
      uVar44 = uVar44 & 0xffffffff;
      lVar27 = uVar44 * 0x60 + 0x20;
      iVar16 = 0;
      do {
        pTVar7 = (pAVar5->tpl_data).tpl_frame;
        frame_params_1.show_frame = 1;
        frame_params_1.show_existing_frame = 0;
        frame_params_1.frame_type = '\x01';
        plVar21 = av1_lookahead_peek(cpi->ppi->lookahead,iVar14,cpi->compressor_stage);
        if (plVar21 != (lookahead_entry *)0x0) {
          pTVar7[uVar44].gf_picture = &plVar21->img;
          pTVar7[uVar44].rec_picture = (pAVar5->tpl_data).tpl_rec_pool + local_2a8;
          pTVar7[uVar44].tpl_stats_ptr = (pAVar5->tpl_data).tpl_stats_pool[local_2a8];
          pTVar7[uVar44].frame_display_index = (cpi->common).current_frame.frame_number + iVar14;
          (pAVar4->gf_group).update_type[uVar44] = '\x01';
          (pAVar4->gf_group).q_val[uVar44] = local_284;
          uVar43 = pTVar7[uVar44].frame_display_index;
          iVar29 = (int)uVar44;
          av1_get_ref_frames(ref_frame_map_pairs,uVar43,cpi,iVar29,0,remapped_ref_idx);
          iVar17 = av1_get_refresh_frame_flags
                             (cpi,&frame_params_1,'\x01',iVar29,uVar43,ref_frame_map_pairs);
          iVar18 = av1_get_refresh_ref_frame_map(iVar17);
          if (iVar18 != -1 && iVar18 < 8) {
            bVar45 = uVar43 != 0;
            if ((int)uVar43 < 1) {
              uVar43 = 0;
            }
            ref_frame_map_pairs[iVar18].disp_order = uVar43;
            iVar35 = 1;
            if (bVar45) {
              iVar31 = (pAVar4->gf_group).layer_depth[uVar44];
              if (iVar31 == 6) {
                iVar35 = (cpi->ppi->gf_group).max_layer_depth;
              }
              else if ((iVar31 != 7) && (iVar35 = iVar31, iVar31 < 2)) {
                iVar35 = 1;
              }
            }
            ref_frame_map_pairs[iVar18].pyr_level = iVar35;
          }
          local_2a8 = local_2a8 + 1;
          lVar41 = 0;
          do {
            *(int *)((long)pTVar7->ref_map_index + lVar41 * 4 + lVar27 + -0x20) =
                 ref_picture_map[remapped_ref_idx[lVar41]];
            lVar41 = lVar41 + 1;
          } while (lVar41 != 7);
          pTVar7[uVar44].ref_map_index[6] = -1;
          pTVar7[uVar44].ref_map_index[2] = -1;
          pTVar7[uVar44].ref_map_index[4] = -1;
          pTVar7[uVar44].ref_map_index[5] = -1;
          if (iVar17 != 0) {
            ref_picture_map[iVar18] = iVar29;
          }
          uVar15 = uVar15 + 1;
          iVar16 = iVar16 + 1;
          iVar14 = iVar14 + 1;
        }
        if ((plVar21 == (lookahead_entry *)0x0) || (0x5e < uVar44)) break;
        uVar44 = uVar44 + 1;
        lVar27 = lVar27 + 0x60;
      } while (iVar16 < iVar13);
    }
    (cpi->ppi->p_rc).base_layer_qp = local_284;
    av1_init_tpl_stats(tpl_data);
    uVar19 = (uint)(pAVar4->tpl_data).tpl_bsize_1d;
    iVar13 = uVar19 * uVar19;
    uVar44 = (ulong)(uint)(iVar13 * 2);
    puVar23 = (uint8_t *)aom_memalign(0x20,uVar44);
    (cpi->td).tpl_tmp_buffers.predictor8 = puVar23;
    piVar24 = (int16_t *)aom_memalign(0x20,uVar44);
    (cpi->td).tpl_tmp_buffers.src_diff = piVar24;
    uVar44 = (ulong)(uint)(iVar13 * 4);
    ptVar25 = (tran_low_t *)aom_memalign(0x20,uVar44);
    (cpi->td).tpl_tmp_buffers.coeff = ptVar25;
    ptVar25 = (tran_low_t *)aom_memalign(0x20,uVar44);
    (cpi->td).tpl_tmp_buffers.qcoeff = ptVar25;
    ptVar25 = (tran_low_t *)aom_memalign(0x20,uVar44);
    (cpi->td).tpl_tmp_buffers.dqcoeff = ptVar25;
    puVar23 = (cpi->td).tpl_tmp_buffers.predictor8;
    if ((((puVar23 == (uint8_t *)0x0) || ((cpi->td).tpl_tmp_buffers.src_diff == (int16_t *)0x0)) ||
        ((cpi->td).tpl_tmp_buffers.coeff == (tran_low_t *)0x0)) ||
       (((cpi->td).tpl_tmp_buffers.qcoeff == (tran_low_t *)0x0 || (ptVar25 == (tran_low_t *)0x0))))
    {
      aom_free(puVar23);
      (cpi->td).tpl_tmp_buffers.predictor8 = (uint8_t *)0x0;
      aom_free((cpi->td).tpl_tmp_buffers.src_diff);
      (cpi->td).tpl_tmp_buffers.src_diff = (int16_t *)0x0;
      aom_free((cpi->td).tpl_tmp_buffers.coeff);
      (cpi->td).tpl_tmp_buffers.coeff = (tran_low_t *)0x0;
      aom_free((cpi->td).tpl_tmp_buffers.qcoeff);
      (cpi->td).tpl_tmp_buffers.qcoeff = (tran_low_t *)0x0;
      aom_free((cpi->td).tpl_tmp_buffers.dqcoeff);
      (cpi->td).tpl_tmp_buffers.dqcoeff = (tran_low_t *)0x0;
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Error allocating tpl data");
    }
    (cpi->mt_info).tpl_row_mt.sync_read_ptr = av1_tpl_row_mt_sync_read_dummy;
    (cpi->mt_info).tpl_row_mt.sync_write_ptr = av1_tpl_row_mt_sync_write_dummy;
    iVar13 = (cpi->common).width;
    iVar16 = (cpi->common).height;
    av1_setup_scale_factors_for_frame(&(cpi->common).sf_identity,iVar13,iVar16,iVar13,iVar16);
    if (frame_params->frame_type == '\0') {
      av1_init_mv_probs(&cpi->common);
    }
    av1_fill_mv_costs(&((cpi->common).fc)->nmvc,
                      (uint)(cpi->common).features.cur_frame_force_integer_mv,
                      (uint)(cpi->common).features.allow_high_precision_mv,(cpi->td).mb.mv_costs);
    local_250 = 1;
    if ((cpi->sf).tpl_sf.use_y_only_rate_distortion == 0) {
      local_250 = (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
    }
    if (((cpi->sf).tpl_sf.reduce_num_frames == 0) ||
       ((pAVar4->gf_group).update_type[cpi->gf_frame_index] == '\0')) {
      bVar45 = false;
    }
    else {
      bVar45 = 2 < (pAVar4->gf_group).max_layer_depth;
    }
    if (bVar45) {
      dVar48 = 1.6;
    }
    else {
      dVar48 = 1.0;
    }
    (pAVar4->tpl_data).r0_adjust_factor = dVar48;
    bVar47 = cpi->gf_frame_index;
    uVar44 = (ulong)bVar47;
    if ((int)(uint)bVar47 < (int)uVar15) {
      lVar27 = (ulong)((uint)bVar47 * 0x60) + 0x20;
      do {
        iVar13 = (pAVar4->gf_group).size;
        if (0x5e < iVar13) {
          iVar13 = 0x5f;
        }
        bVar47 = (pAVar4->gf_group).update_type[uVar44];
        if ((((bVar47 & 0xfe) != 4) &&
            ((gop_eval < 2 ||
             ((long)uVar44 < (long)iVar13 &&
              (pAVar4->gf_group).layer_depth[uVar44] <= (int)(gop_eval == 2 | 2))))) &&
           ((!bVar45 || (bVar47 != 1 || (long)iVar13 <= (long)uVar44)))) {
          pAVar5 = cpi->ppi;
          bVar12 = false;
          if ((0 < (cpi->sf).inter_sf.selective_ref_frame) &&
             (0 < (cpi->sf).tpl_sf.prune_ref_frames_in_tpl)) {
            bVar47 = (pAVar5->gf_group).update_type[uVar44 & 0xff];
            bVar12 = bVar47 != 0 && (bVar47 & 0xfe) != 2;
          }
          pTVar8 = (pAVar5->tpl_data).tpl_frame;
          pTVar7 = pTVar8 + uVar44;
          pYVar22 = pTVar8[uVar44].gf_picture;
          iVar13 = (pAVar5->gf_group).size;
          (pAVar5->tpl_data).frame_idx = (int)uVar44;
          (pAVar5->tpl_data).src_ref_frame[0] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar5->tpl_data).src_ref_frame[1] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar5->tpl_data).src_ref_frame[2] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar5->tpl_data).src_ref_frame[3] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar5->tpl_data).src_ref_frame[4] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar5->tpl_data).src_ref_frame[5] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar5->tpl_data).src_ref_frame[6] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar5->tpl_data).ref_frame[0] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar5->tpl_data).ref_frame[1] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar5->tpl_data).ref_frame[2] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar5->tpl_data).ref_frame[3] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar5->tpl_data).ref_frame[4] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar5->tpl_data).ref_frame[5] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar5->tpl_data).ref_frame[6] = (YV12_BUFFER_CONFIG *)0x0;
          av1_tile_init(&(cpi->td).mb.e_mbd.tile,&cpi->common,0,0);
          iVar16 = (cpi->ppi->p_rc).gfu_boost;
          iVar14 = (pAVar5->gf_group).layer_depth[cpi->gf_frame_index];
          FVar1 = (cpi->common).current_frame.frame_type;
          sf = &(pAVar5->tpl_data).sf;
          iVar17 = (pYVar22->field_2).field_0.y_crop_width;
          iVar18 = (pYVar22->field_3).field_0.y_crop_height;
          av1_setup_scale_factors_for_frame(sf,iVar17,iVar18,iVar17,iVar18);
          (cpi->td).mb.e_mbd.cur_buf = pYVar22;
          pTVar9 = (pAVar5->tpl_data).tpl_frame;
          lVar41 = 0;
          do {
            iVar17 = *(int *)((long)pTVar8->ref_map_index + lVar41 * 4 + lVar27 + -0x20);
            (pAVar5->tpl_data).ref_frame[lVar41] = pTVar9[iVar17].rec_picture;
            (pAVar5->tpl_data).src_ref_frame[lVar41] = pTVar9[iVar17].gf_picture;
            remapped_ref_idx[lVar41] = pTVar9[iVar17].frame_display_index;
            lVar41 = lVar41 + 1;
          } while (lVar41 != 7);
          if (0x5e < iVar13) {
            iVar13 = 0x5f;
          }
          lVar41 = 0;
          do {
            ref_frame_map_pairs[lVar41] =
                 *(RefFrameMapPair *)
                  ((pAVar5->tpl_data).src_ref_frame + (long)"\x01\a\x05\x04\x06\x02\x03"[lVar41] + 6
                  );
            lVar41 = lVar41 + 1;
          } while (lVar41 != 7);
          iVar17 = iVar16 / 100;
          if (0x63f < iVar16) {
            iVar17 = 0xf;
          }
          if (5 < iVar14) {
            iVar14 = 6;
          }
          aVar3 = (cpi->oxcf).pass;
          if (((aVar3 == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
             ((cpi->oxcf).mode == '\x01')) {
            bVar46 = (cpi->oxcf).gf_cfg.lag_in_frames == 0;
          }
          else {
            bVar46 = false;
          }
          uVar19 = (cpi->ext_flags).ref_frame_flags;
          lVar41 = 1;
          do {
            uVar34 = (uint)lVar41;
            if (lVar41 == 3 && bVar46) {
              uVar34 = (cpi->sf).rt_sf.use_nonrd_altref_frame + 1;
            }
            if (0 < (int)uVar34) {
              uVar40 = 0;
              do {
                if ((ref_frame_map_pairs[lVar41] == ref_frame_map_pairs[uVar40]) &&
                   ((uVar19 >> ((byte)("\x01\a\x05\x04\x06\x02\x03"[uVar40] - 1) & 0x1f) & 1) != 0))
                {
                  uVar19 = uVar19 & ~(1 << ((byte)("\x01\a\x05\x04\x06\x02\x03"[lVar41] - 1) & 0x1f)
                                     );
                  break;
                }
                uVar40 = uVar40 + 1;
              } while (uVar34 != uVar40);
            }
            lVar41 = lVar41 + 1;
          } while (lVar41 != 7);
          uVar34 = 0;
          lVar41 = 1;
          do {
            uVar34 = (uVar34 + 1) - (uint)((""[lVar41] & uVar19) == 0);
            lVar41 = lVar41 + 1;
          } while (lVar41 != 8);
          uVar30 = (cpi->oxcf).ref_frm_cfg.max_reference_frames;
          iVar16 = (cpi->sf).inter_sf.selective_ref_frame;
          uVar39 = 7;
          if (2 < iVar16) {
            uVar39 = 4;
            if (((iVar16 < 6) && (uVar39 = 6, iVar16 == 5)) && ((uVar19 & 2) != 0)) {
              uVar39 = remapped_ref_idx[1] - pTVar7->frame_display_index;
              uVar11 = -uVar39;
              if (0 < (int)uVar39) {
                uVar11 = uVar39;
              }
              uVar39 = 5;
              if ((uVar11 < 3) && (uVar39 = 6, AOM_RC_FIRST_PASS < aVar3)) {
                pSVar10 = (cpi->ppi->twopass).stats_buf_ctx;
                pFVar38 = pSVar10->stats_in_start + pTVar7->frame_display_index;
                pFVar42 = (FIRSTPASS_STATS *)0x0;
                if (pFVar38 <= pSVar10->stats_in_end) {
                  pFVar42 = pFVar38;
                }
                uVar39 = (100.0 < pFVar42->coded_error || pFVar42->coded_error == 100.0) + 5;
              }
            }
          }
          if (uVar39 < uVar30) {
            uVar30 = uVar39;
          }
          if (uVar30 < uVar34) {
            uVar40 = 0;
            do {
              if ((uVar19 & ""["\x03\x02\x06\x05"[uVar40]]) != 0) {
                switch("\x03\x02\x06\x05"[uVar40]) {
                case '\x02':
                  uVar19 = uVar19 & 0xfffffffd;
                  break;
                case '\x03':
                  uVar19 = uVar19 & 0xfffffffb;
                  break;
                case '\x05':
                  uVar19 = uVar19 & 0xfffffff7;
                  break;
                case '\x06':
                  uVar19 = uVar19 & 0xffffffdf;
                }
                uVar34 = uVar34 - 1;
              }
            } while ((uVar40 < 3) && (uVar40 = uVar40 + 1, (int)uVar30 < (int)uVar34));
          }
          lVar41 = 0;
          do {
            if ((uVar19 >> ((uint)lVar41 & 0x1f) & 1) == 0) {
              (pAVar5->tpl_data).ref_frame[lVar41] = (YV12_BUFFER_CONFIG *)0x0;
            }
            lVar41 = lVar41 + 1;
          } while (lVar41 != 7);
          if ((bool)(bVar12 & (long)uVar44 < (long)iVar13)) {
            uVar40 = 0;
            do {
              uVar33 = uVar40 + 1;
              if (iVar16 != 0) {
                if (iVar16 < 2) {
LAB_0023a7ec:
                  if (2 < iVar16) {
                    frame_params_1.error_resilient_mode = 6;
                    frame_params_1.frame_type = '\x05';
                    frame_params_1._5_3_ = 0;
                    bVar12 = true;
                    lVar41 = 0;
                    do {
                      uVar19 = frame_params_1.remapped_ref_idx[lVar41 + -9];
                      if ((uVar33 == uVar19 && uVar19 != 0xffffffff) &&
                         (remapped_ref_idx[(long)(int)uVar19 + -1] < remapped_ref_idx[0])) break;
                      lVar41 = lVar41 + 1;
                      bVar12 = lVar41 == 1;
                    } while (bVar12);
                    if (bVar12) goto LAB_0023a851;
                  }
                }
                else {
                  frame_params_1.error_resilient_mode = 3;
                  frame_params_1.frame_type = '\x02';
                  frame_params_1._5_3_ = 0;
                  bVar12 = true;
                  lVar41 = 0;
                  do {
                    uVar19 = frame_params_1.remapped_ref_idx[lVar41 + -9];
                    if ((uVar33 == uVar19 && uVar19 != 0xffffffff) &&
                       (remapped_ref_idx[(long)(int)uVar19 + -1] < remapped_ref_idx[3])) break;
                    lVar41 = lVar41 + 1;
                    bVar12 = lVar41 == 1;
                  } while (bVar12);
                  if (!bVar12) goto LAB_0023a7ec;
LAB_0023a851:
                  (pAVar5->tpl_data).ref_frame[uVar40] = (YV12_BUFFER_CONFIG *)0x0;
                }
              }
              uVar40 = uVar33;
            } while (uVar33 != 7);
          }
          memset(&frame_params_1,0,0xb0);
          (cpi->td).mb.e_mbd.mi = (MB_MODE_INFO **)ref_picture_map;
          (cpi->td).mb.e_mbd.block_ref_scale_factors[0] = sf;
          (cpi->td).mb.e_mbd.block_ref_scale_factors[1] = sf;
          iVar13 = local_284;
          if (cpi->use_ducky_encode != 0) {
            iVar13 = (pAVar5->gf_group).q_val[uVar44];
          }
          bVar12 = AOM_RC_FIRST_PASS < aVar3;
          if (aVar3 == AOM_RC_ONE_PASS) {
            if (cpi->compressor_stage == '\0') {
              bVar12 = cpi->ppi->lap_enabled != 0;
            }
            else {
              bVar12 = false;
            }
          }
          ref_picture_map._0_8_ = &frame_params_1;
          uVar19 = av1_compute_rd_mult(iVar13,((cpi->common).seq_params)->bit_depth,
                                       (cpi->ppi->gf_group).update_type[cpi->gf_frame_index],iVar14,
                                       iVar17,FVar1,(cpi->oxcf).q_cfg.use_fixed_qp_offsets,
                                       (uint)bVar12,(cpi->oxcf).tune_cfg.tuning);
          if ((int)uVar19 < 2) {
            uVar19 = 0;
          }
          uVar19 = uVar19 >> 6;
          if (uVar19 < 2) {
            uVar19 = 1;
          }
          (cpi->td).mb.errorperbit = uVar19;
          av1_set_sad_per_bit(cpi,&(cpi->td).mb.sadperbit,iVar13);
          pTVar7->is_valid = '\x01';
          (cpi->common).quant_params.base_qindex = iVar13;
          av1_frame_init_quantizer(cpi);
          iVar13 = av1_compute_rd_mult_based_on_qindex
                             ((cpi->td).mb.e_mbd.bd,
                              (pAVar5->gf_group).update_type[cpi->gf_frame_index],iVar13,
                              (cpi->oxcf).tune_cfg.tuning);
          pTVar7->base_rdmult = iVar13 / 6;
          if (cpi->use_ducky_encode != 0) {
            pTVar7->base_rdmult = (pAVar5->gf_group).rdmult_val[uVar44];
          }
          (cpi->td).tpl_txfm_stats.ready = 0;
          (cpi->td).tpl_txfm_stats.coeff_num = 0x100;
          memset((cpi->td).tpl_txfm_stats.abs_coeff_sum,0,0x1004);
          if ((cpi->sf).tpl_sf.allow_compound_pred != 0) {
            memset(&(cpi->td).mb.mbmi_ext,0,0x504);
          }
          (cpi->td).mb.e_mbd.mi = (MB_MODE_INFO **)0x0;
          iVar13 = (cpi->sf).tpl_sf.use_sad_for_mode_decision;
          uVar19 = 0;
          if ((iVar13 != 0) && ((pAVar5->gf_group).update_type[cpi->gf_frame_index] != '\0')) {
            uVar19 = (uint)(iVar13 == 1);
            iVar13 = (pAVar5->gf_group).layer_depth[uVar44];
            uVar19 = (uint)(SBORROW4(iVar13,uVar19 * 5) == (int)(iVar13 + uVar19 * -5) < 0);
          }
          pTVar7->use_pred_sad = uVar19;
          if ((cpi->mt_info).num_workers < 2) {
            bVar47 = (cpi->ppi->tpl_data).tpl_bsize_1d;
            if (bVar47 < 0x10) {
              if (bVar47 == 4) {
                BVar26 = BLOCK_4X4;
              }
              else {
                if (bVar47 != 8) goto LAB_0023ab6b;
                BVar26 = BLOCK_8X8;
              }
            }
            else if (bVar47 == 0x10) {
LAB_0023ab6b:
              BVar26 = BLOCK_16X16;
            }
            else {
              BVar26 = BLOCK_64X64;
              if (bVar47 != 0x40) {
                if (bVar47 != 0x20) goto LAB_0023ab6b;
                BVar26 = BLOCK_32X32;
              }
            }
            iVar13 = (cpi->common).mi_params.mi_rows;
            if (0 < iVar13) {
              tx_size = ""[BVar26];
              bVar47 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [BVar26];
              iVar17 = 8;
              iVar14 = 0;
              iVar18 = 0;
              iVar16 = 0;
              do {
                iVar29 = (cpi->ppi->tpl_data).border_in_pixels;
                iVar35 = iVar17 - iVar29;
                iVar31 = (uint)bVar47 * -4 + iVar17 + -0x10;
                if (iVar35 <= iVar31) {
                  iVar35 = iVar31;
                }
                iVar31 = (uint)bVar47 + iVar16;
                (cpi->td).mb.mv_limits.row_min = iVar35;
                iVar35 = (cpi->common).mi_params.mi_rows;
                iVar36 = iVar14 - (uint)bVar47;
                uVar34 = (iVar29 + (iVar35 + iVar36) * 4) - 8;
                uVar19 = (iVar35 + iVar14) * 4 + 8;
                if ((int)uVar34 < (int)uVar19) {
                  uVar19 = uVar34;
                }
                (cpi->td).mb.mv_limits.row_max = uVar19;
                (cpi->td).mb.e_mbd.mb_to_top_edge = iVar18;
                (cpi->td).mb.e_mbd.mb_to_bottom_edge = (iVar13 + iVar36) * 0x20;
                av1_mc_flow_dispenser_row
                          (cpi,(TplTxfmStats *)(ulong)uVar19,&(cpi->td).tpl_tmp_buffers,
                           &(cpi->td).mb,iVar16,BVar26,tx_size);
                iVar13 = (cpi->common).mi_params.mi_rows;
                iVar17 = iVar17 + (uint)bVar47 * -4;
                iVar18 = iVar18 + (uint)bVar47 * -0x20;
                iVar14 = iVar14 - (uint)bVar47;
                iVar16 = iVar31;
              } while (iVar31 < iVar13);
            }
          }
          else {
            (cpi->mt_info).tpl_row_mt.sync_read_ptr = av1_tpl_row_mt_sync_read;
            (cpi->mt_info).tpl_row_mt.sync_write_ptr = av1_tpl_row_mt_sync_write;
            av1_mc_flow_dispenser_mt(cpi);
          }
          aom_extend_frame_borders_c((pAVar4->tpl_data).tpl_frame[uVar44].rec_picture,local_250);
        }
        uVar44 = uVar44 + 1;
        lVar27 = lVar27 + 0x60;
      } while (uVar44 != uVar15);
    }
    uVar44 = (ulong)cpi->gf_frame_index;
    if ((int)(uint)cpi->gf_frame_index < (int)uVar15) {
      local_290 = gop_eval == 2 | 2;
      lVar27 = (long)(int)uVar15;
      do {
        lVar41 = lVar27 + -1;
        iVar13 = (pAVar4->gf_group).size;
        if (0x5e < iVar13) {
          iVar13 = 0x5f;
        }
        bVar47 = (pAVar4->gf_group).update_type[lVar27 + -1];
        if (((((bVar47 & 0xfe) != 4) &&
             ((gop_eval < 2 ||
              (((pAVar4->gf_group).layer_depth[lVar27 + -1] <= (int)local_290 && (lVar27 <= iVar13))
              )))) && ((!bVar45 || (bVar47 != 1 || iVar13 < lVar27)))) && (lVar41 != 0)) {
          bVar47 = (pAVar4->tpl_data).tpl_bsize_1d;
          if (bVar47 < 0x10) {
            if (bVar47 == 4) {
              lVar27 = 0;
            }
            else {
              if (bVar47 != 8) goto LAB_0023adeb;
              lVar27 = 3;
            }
          }
          else if (bVar47 == 0x10) {
LAB_0023adeb:
            lVar27 = 6;
          }
          else {
            lVar27 = 0xc;
            if (bVar47 != 0x40) {
              if (bVar47 != 0x20) goto LAB_0023adeb;
              lVar27 = 9;
            }
          }
          iVar13 = (cpi->common).mi_params.mi_rows;
          if (0 < iVar13) {
            iVar16 = (cpi->common).mi_params.mi_cols;
            bVar47 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [lVar27];
            bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [lVar27];
            iVar14 = 0;
            do {
              if (0 < iVar16) {
                iVar17 = 0;
                do {
                  iVar18 = 4 << ((pAVar4->tpl_data).tpl_stats_block_mis_log2 & 0x1f);
                  if (iVar18 < 0x10) {
                    if (iVar18 == 4) {
                      BVar26 = BLOCK_4X4;
                    }
                    else {
                      if (iVar18 != 8) goto LAB_0023ae74;
                      BVar26 = BLOCK_8X8;
                    }
                  }
                  else if (iVar18 == 0x10) {
LAB_0023ae74:
                    BVar26 = BLOCK_16X16;
                  }
                  else {
                    BVar26 = BLOCK_64X64;
                    if (iVar18 != 0x40) {
                      if (iVar18 != 0x20) goto LAB_0023ae74;
                      BVar26 = BLOCK_32X32;
                    }
                  }
                  tpl_model_update_b(tpl_data,iVar14,iVar17,BVar26,(int)lVar41,0);
                  tpl_model_update_b(tpl_data,iVar14,iVar17,BVar26,(int)lVar41,1);
                  iVar17 = iVar17 + (uint)bVar2;
                } while (iVar17 < iVar16);
              }
              iVar14 = iVar14 + (uint)bVar47;
            } while (iVar14 < iVar13);
          }
        }
        uVar44 = (ulong)cpi->gf_frame_index;
        lVar27 = lVar41;
      } while ((long)uVar44 < lVar41);
    }
    type = (pAVar4->gf_group).update_type[uVar44];
    uVar19 = 0;
    av1_configure_buffer_updates(cpi,&this_frame_params.refresh_frame,type,type,0);
    (cpi->common).current_frame.frame_type = frame_params->frame_type;
    (cpi->common).show_frame = frame_params->show_frame;
    aom_free((cpi->td).tpl_tmp_buffers.predictor8);
    (cpi->td).tpl_tmp_buffers.predictor8 = (uint8_t *)0x0;
    aom_free((cpi->td).tpl_tmp_buffers.src_diff);
    (cpi->td).tpl_tmp_buffers.src_diff = (int16_t *)0x0;
    aom_free((cpi->td).tpl_tmp_buffers.coeff);
    (cpi->td).tpl_tmp_buffers.coeff = (tran_low_t *)0x0;
    aom_free((cpi->td).tpl_tmp_buffers.qcoeff);
    (cpi->td).tpl_tmp_buffers.qcoeff = (tran_low_t *)0x0;
    aom_free((cpi->td).tpl_tmp_buffers.dqcoeff);
    (cpi->td).tpl_tmp_buffers.dqcoeff = (tran_low_t *)0x0;
    if (gop_eval < 2) {
      tpl_data->ready = 1;
    }
    if ((cpi->common).tiles.large_scale == 0) {
      if ((pAVar4->gf_group).max_layer_depth_allowed == 0) {
        uVar19 = 1;
      }
      else if (gop_eval != 0) {
        iVar16 = (pAVar4->gf_group).arf_index;
        iVar13 = iVar16 + 1;
        iVar14 = uVar15 - 1;
        if (iVar13 < (int)uVar15) {
          iVar14 = iVar13;
        }
        dVar48 = get_frame_importance(tpl_data,iVar16);
        dVar49 = get_frame_importance(tpl_data,iVar14);
        if (gop_eval == 3) {
          uVar19 = (uint)(1.1 < dVar48);
        }
        else if (gop_eval == 2) {
          if ((dVar48 <= 1.6) || (uVar19 = 1, dVar48 < dVar49 + 0.4)) {
            uVar19 = (-(uint)(dVar49 + 0.1 <= dVar48 && 1.4 < dVar48) & 1) * 2;
          }
        }
        else {
          uVar19 = 2;
          if (gop_eval == 1) {
            uVar19 = -(uint)(3.0 < dVar48 && dVar49 + 0.7 <= dVar48) & 1;
          }
        }
      }
    }
  }
  else {
    av1_init_tpl_stats(tpl_data);
    uVar19 = 0;
  }
  return uVar19;
}

Assistant:

int av1_tpl_setup_stats(AV1_COMP *cpi, int gop_eval,
                        const EncodeFrameParams *const frame_params) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_tpl_setup_stats_time);
#endif
  assert(cpi->gf_frame_index == 0);
  AV1_COMMON *cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1TplRowMultiThreadInfo *const tpl_row_mt = &mt_info->tpl_row_mt;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  EncodeFrameParams this_frame_params = *frame_params;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  int approx_gop_eval = (gop_eval > 1);

  if (cpi->superres_mode != AOM_SUPERRES_NONE) {
    assert(cpi->superres_mode != AOM_SUPERRES_AUTO);
    av1_init_tpl_stats(tpl_data);
    return 0;
  }

  cm->current_frame.frame_type = frame_params->frame_type;
  for (int gf_index = cpi->gf_frame_index; gf_index < gf_group->size;
       ++gf_index) {
    cm->current_frame.frame_type = gf_group->frame_type[gf_index];
    av1_configure_buffer_updates(cpi, &this_frame_params.refresh_frame,
                                 gf_group->update_type[gf_index],
                                 gf_group->refbuf_state[gf_index], 0);

    memcpy(&cpi->refresh_frame, &this_frame_params.refresh_frame,
           sizeof(cpi->refresh_frame));
  }

  int pframe_qindex;
  int tpl_gf_group_frames;
  init_gop_frames_for_tpl(cpi, frame_params, gf_group, &tpl_gf_group_frames,
                          &pframe_qindex);

  cpi->ppi->p_rc.base_layer_qp = pframe_qindex;

  av1_init_tpl_stats(tpl_data);

  TplBuffers *tpl_tmp_buffers = &cpi->td.tpl_tmp_buffers;
  if (!tpl_alloc_temp_buffers(tpl_tmp_buffers, tpl_data->tpl_bsize_1d)) {
    aom_internal_error(cpi->common.error, AOM_CODEC_MEM_ERROR,
                       "Error allocating tpl data");
  }

  tpl_row_mt->sync_read_ptr = av1_tpl_row_mt_sync_read_dummy;
  tpl_row_mt->sync_write_ptr = av1_tpl_row_mt_sync_write_dummy;

  av1_setup_scale_factors_for_frame(&cm->sf_identity, cm->width, cm->height,
                                    cm->width, cm->height);

  if (frame_params->frame_type == KEY_FRAME) {
    av1_init_mv_probs(cm);
  }
  av1_fill_mv_costs(&cm->fc->nmvc, cm->features.cur_frame_force_integer_mv,
                    cm->features.allow_high_precision_mv, cpi->td.mb.mv_costs);

  const int num_planes =
      cpi->sf.tpl_sf.use_y_only_rate_distortion ? 1 : av1_num_planes(cm);
  // As tpl module is called before the setting of speed features at frame
  // level, turning off this speed feature for the first GF group of the
  // key-frame interval is done here.
  int reduce_num_frames =
      cpi->sf.tpl_sf.reduce_num_frames &&
      gf_group->update_type[cpi->gf_frame_index] != KF_UPDATE &&
      gf_group->max_layer_depth > 2;
  // TPL processing is skipped for frames of type LF_UPDATE when
  // 'reduce_num_frames' is 1, which affects the r0 calcuation. Thus, a factor
  // to adjust r0 is used. The value of 1.6 corresponds to using ~60% of the
  // frames in the gf group on an average.
  tpl_data->r0_adjust_factor = reduce_num_frames ? 1.6 : 1.0;

  // Backward propagation from tpl_group_frames to 1.
  for (int frame_idx = cpi->gf_frame_index; frame_idx < tpl_gf_group_frames;
       ++frame_idx) {
    if (skip_tpl_for_frame(gf_group, frame_idx, gop_eval, approx_gop_eval,
                           reduce_num_frames))
      continue;

    init_mc_flow_dispenser(cpi, frame_idx, pframe_qindex);
    if (mt_info->num_workers > 1) {
      tpl_row_mt->sync_read_ptr = av1_tpl_row_mt_sync_read;
      tpl_row_mt->sync_write_ptr = av1_tpl_row_mt_sync_write;
      av1_mc_flow_dispenser_mt(cpi);
    } else {
      mc_flow_dispenser(cpi);
    }
#if CONFIG_BITRATE_ACCURACY
    av1_tpl_txfm_stats_update_abs_coeff_mean(&cpi->td.tpl_txfm_stats);
    av1_tpl_store_txfm_stats(tpl_data, &cpi->td.tpl_txfm_stats, frame_idx);
#endif  // CONFIG_BITRATE_ACCURACY
#if CONFIG_RATECTRL_LOG && CONFIG_THREE_PASS && CONFIG_BITRATE_ACCURACY
    if (cpi->oxcf.pass == AOM_RC_THIRD_PASS) {
      int frame_coding_idx =
          av1_vbr_rc_frame_coding_idx(&cpi->vbr_rc_info, frame_idx);
      rc_log_frame_stats(&cpi->rc_log, frame_coding_idx,
                         &cpi->td.tpl_txfm_stats);
    }
#endif  // CONFIG_RATECTRL_LOG

    aom_extend_frame_borders(tpl_data->tpl_frame[frame_idx].rec_picture,
                             num_planes);
  }

  for (int frame_idx = tpl_gf_group_frames - 1;
       frame_idx >= cpi->gf_frame_index; --frame_idx) {
    if (skip_tpl_for_frame(gf_group, frame_idx, gop_eval, approx_gop_eval,
                           reduce_num_frames))
      continue;

    mc_flow_synthesizer(tpl_data, frame_idx, cm->mi_params.mi_rows,
                        cm->mi_params.mi_cols);
  }

  av1_configure_buffer_updates(cpi, &this_frame_params.refresh_frame,
                               gf_group->update_type[cpi->gf_frame_index],
                               gf_group->update_type[cpi->gf_frame_index], 0);
  cm->current_frame.frame_type = frame_params->frame_type;
  cm->show_frame = frame_params->show_frame;

#if CONFIG_COLLECT_COMPONENT_TIMING
  // Record the time if the function returns.
  if (cpi->common.tiles.large_scale || gf_group->max_layer_depth_allowed == 0 ||
      !gop_eval)
    end_timing(cpi, av1_tpl_setup_stats_time);
#endif

  tpl_dealloc_temp_buffers(tpl_tmp_buffers);

  if (!approx_gop_eval) {
    tpl_data->ready = 1;
  }
  if (cpi->common.tiles.large_scale) return 0;
  if (gf_group->max_layer_depth_allowed == 0) return 1;
  if (!gop_eval) return 0;
  assert(gf_group->arf_index >= 0);

  double beta[2] = { 0.0 };
  const int frame_idx_0 = gf_group->arf_index;
  const int frame_idx_1 =
      AOMMIN(tpl_gf_group_frames - 1, gf_group->arf_index + 1);
  beta[0] = get_frame_importance(tpl_data, frame_idx_0);
  beta[1] = get_frame_importance(tpl_data, frame_idx_1);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_tpl_setup_stats_time);
#endif
  return eval_gop_length(beta, gop_eval);
}